

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

longlong __thiscall mkvparser::Block::GetTimeCode(Block *this,Cluster *pCluster)

{
  ulong uVar1;
  long lVar2;
  long len;
  longlong pos;
  long local_20;
  longlong local_18;
  
  if (pCluster == (Cluster *)0x0) {
    lVar2 = (long)this->m_timecode;
  }
  else {
    uVar1 = Cluster::Load(pCluster,&local_18,&local_20);
    if (-1 < (long)uVar1) {
      uVar1 = pCluster->m_timecode;
    }
    if ((long)uVar1 < 0) {
      __assert_fail("tc0 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1f47,"long long mkvparser::Block::GetTimeCode(const Cluster *) const");
    }
    lVar2 = -1;
    if ((long)this->m_timecode <= (long)(uVar1 ^ 0x7fffffffffffffff)) {
      lVar2 = uVar1 + (long)this->m_timecode;
    }
  }
  return lVar2;
}

Assistant:

long long Block::GetTimeCode(const Cluster* pCluster) const {
  if (pCluster == 0)
    return m_timecode;

  const long long tc0 = pCluster->GetTimeCode();
  assert(tc0 >= 0);

  // Check if tc0 + m_timecode would overflow.
  if (tc0 < 0 || LLONG_MAX - tc0 < m_timecode) {
    return -1;
  }

  const long long tc = tc0 + m_timecode;

  return tc;  // unscaled timecode units
}